

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QString,_QList<QString>_>_>::Data
          (Data<QHashPrivate::Node<QString,_QList<QString>_>_> *this,
          Data<QHashPrivate::Node<QString,_QList<QString>_>_> *other)

{
  byte bVar1;
  Span *pSVar2;
  Entry *pEVar3;
  Data *pDVar4;
  Data *pDVar5;
  Node<QString,_QList<QString>_> *pNVar6;
  long lVar7;
  size_t sVar8;
  size_t sVar9;
  ulong uVar10;
  R RVar11;
  
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  this->size = other->size;
  sVar8 = other->numBuckets;
  sVar9 = other->seed;
  this->numBuckets = other->numBuckets;
  this->seed = sVar9;
  this->spans = (Span *)0x0;
  RVar11 = allocateSpans(sVar8);
  this->spans = (Span *)RVar11.spans;
  if (RVar11.nSpans != 0) {
    lVar7 = 0;
    sVar8 = 0;
    do {
      pSVar2 = other->spans;
      sVar9 = 0;
      do {
        bVar1 = pSVar2->offsets[sVar9 + lVar7];
        if (bVar1 != 0xff) {
          pEVar3 = pSVar2[sVar8].entries;
          uVar10 = (ulong)((uint)bVar1 * 0x30);
          pNVar6 = Span<QHashPrivate::Node<QString,_QList<QString>_>_>::insert
                             (this->spans + sVar8,sVar9);
          pDVar4 = *(Data **)((pEVar3->storage).data + uVar10);
          (pNVar6->key).d.d = pDVar4;
          (pNVar6->key).d.ptr = *(char16_t **)((pEVar3->storage).data + uVar10 + 8);
          (pNVar6->key).d.size = *(qsizetype *)((pEVar3->storage).data + uVar10 + 0x10);
          if (pDVar4 != (Data *)0x0) {
            LOCK();
            (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> =
                 (__atomic_base<int>)
                 ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1)
            ;
            UNLOCK();
          }
          pDVar5 = *(Data **)((pEVar3->storage).data + uVar10 + 0x18);
          (pNVar6->value).d.d = pDVar5;
          (pNVar6->value).d.ptr = *(QString **)((pEVar3->storage).data + uVar10 + 0x20);
          (pNVar6->value).d.size = *(qsizetype *)((pEVar3->storage).data + uVar10 + 0x28);
          if (pDVar5 != (Data *)0x0) {
            LOCK();
            (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
        }
        sVar9 = sVar9 + 1;
      } while (sVar9 != 0x80);
      sVar8 = sVar8 + 1;
      lVar7 = lVar7 + 0x90;
    } while (sVar8 != RVar11.nSpans);
  }
  return;
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }